

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_memory.h
# Opt level: O0

void * mk_mem_alloc(size_t size)

{
  void *aux;
  size_t size_local;
  
  size_local = (size_t)malloc(size);
  if ((void *)size_local == (void *)0x0 && size != 0) {
    perror("malloc");
    size_local = 0;
  }
  return (void *)size_local;
}

Assistant:

static inline ALLOCSZ_ATTR(1)
void *mk_mem_alloc(const size_t size)
{
#ifdef MALLOC_JEMALLOC
    void *aux = je_malloc(size);
#else
    void *aux = malloc(size);
#endif

    if (mk_unlikely(!aux && size)) {
        perror("malloc");
        return NULL;
    }

    return aux;
}